

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::BuildVertexIndicesImpl
          (RenderSceneConverter *this,RenderMesh *mesh)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  VertexAttribute *this_00;
  VertexAttribute *this_01;
  unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
  *this_02;
  _Rb_tree_color *p_Var2;
  uint uVar3;
  int iVar4;
  _Rb_tree_color _Var5;
  _Rb_tree_color _Var6;
  float *pfVar7;
  iterator __position;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  array<float,_3UL> *paVar13;
  pointer paVar14;
  size_t sVar15;
  ostream *poVar16;
  pointer puVar17;
  pointer puVar18;
  pointer puVar19;
  uint *puVar20;
  ulong uVar21;
  mapped_type *this_03;
  _Hash_node_base *p_Var22;
  _Base_ptr p_Var23;
  mapped_type *pmVar24;
  long lVar25;
  uint *puVar26;
  long lVar27;
  ulong uVar28;
  unsigned_long *puVar29;
  size_type __n;
  _Base_ptr p_Var30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar31;
  _Hash_node_base *p_Var32;
  uint uVar33;
  char *pcVar34;
  ulong uVar35;
  float *pfVar36;
  _Base_ptr p_Var37;
  array<float,_3UL> *paVar38;
  _Base_ptr p_Var39;
  _Alloc_hider _Var40;
  size_t k;
  pointer paVar41;
  long lVar42;
  long lVar43;
  bool bVar44;
  size_t num_fvs;
  size_t fvi;
  vector<float,_std::allocator<float>_> tmp_weights;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmpPointIndices;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  pointIdxRemap;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_point_indices;
  DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> vertex_output;
  ostringstream ss_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_indices;
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> vertex_input;
  _Hash_node_base *local_468;
  _Hash_node_base *local_458;
  pointer local_450;
  string local_448;
  vector<float,_std::allocator<float>_> local_428;
  undefined8 local_410;
  undefined8 local_408;
  iterator iStack_400;
  array<float,_3UL> *local_3f8;
  undefined8 local_3e8;
  iterator iStack_3e0;
  _Base_ptr local_3d8;
  _Base_ptr local_3c8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_388;
  unsigned_long *local_370;
  pointer local_368;
  undefined1 local_360 [32];
  pointer local_340;
  pointer local_330;
  pointer local_328;
  pointer local_318;
  pointer local_310;
  pointer local_300;
  pointer local_2f8;
  pointer local_2e8;
  pointer local_2e0;
  pointer local_2d0;
  pointer local_2c8;
  pointer local_2b8;
  pointer local_2b0;
  value_type local_2a0 [9];
  ios_base local_230 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  array<float,_3UL> *local_110;
  pointer local_108;
  pointer local_100;
  _Base_ptr local_f8;
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> local_f0;
  
  pvVar1 = &mesh->usdFaceVertexIndices;
  pvVar31 = &mesh->triangulatedFaceVertexIndices;
  if ((mesh->triangulatedFaceVertexIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (mesh->triangulatedFaceVertexIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pvVar31 = pvVar1;
  }
  memset(&local_f0,0,0xc0);
  paVar41 = (pointer)((long)(pvVar31->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(pvVar31->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start >> 2);
  local_450 = paVar41;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&local_f0.point_indices,pvVar31);
  local_2a0[0]._M_elems[0] = 0.0;
  local_2a0[0]._M_elems[1] = 0.0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::_M_fill_assign
            (&local_f0.uv0s,(size_type)paVar41,(value_type *)local_2a0);
  local_2a0[0]._M_elems[0] = 0.0;
  local_2a0[0]._M_elems[1] = 0.0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::_M_fill_assign
            (&local_f0.uv1s,(size_type)paVar41,(value_type *)local_2a0);
  local_2a0[0]._M_elems[0] = 0.0;
  local_2a0[0]._M_elems[1] = 0.0;
  local_2a0[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.normals,(size_type)paVar41,local_2a0);
  local_2a0[0]._M_elems[0] = 0.0;
  local_2a0[0]._M_elems[1] = 0.0;
  local_2a0[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.tangents,(size_type)paVar41,local_2a0);
  local_2a0[0]._M_elems[0] = 0.0;
  local_2a0[0]._M_elems[1] = 0.0;
  local_2a0[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.binormals,(size_type)paVar41,local_2a0);
  local_2a0[0]._M_elems[0] = 0.0;
  local_2a0[0]._M_elems[1] = 0.0;
  local_2a0[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.colors,(size_type)paVar41,local_2a0);
  local_2a0[0]._M_elems._0_8_ = local_2a0[0]._M_elems._0_8_ & 0xffffffff00000000;
  ::std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (&local_f0.opacities,(size_type)paVar41,local_2a0[0]._M_elems);
  this_00 = &mesh->normals;
  paVar14 = (pointer)VertexAttribute::vertex_count(this_00);
  if (paVar14 != (pointer)0x0) {
    if ((mesh->normals).variability == FaceVarying) {
      paVar14 = (pointer)VertexAttribute::vertex_count(this_00);
      if (paVar14 == paVar41) goto LAB_00331755;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x9cf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      pcVar34 = 
      "Internal error. The number of normal items does not match with the number of facevarying items."
      ;
      lVar25 = 0x5f;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x9ca);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      pcVar34 = "Internal error. normals must be \'facevarying\' variability.";
      lVar25 = 0x3a;
    }
    goto LAB_00332a57;
  }
LAB_00331755:
  p_Var32 = (mesh->texcoords)._M_h._M_before_begin._M_nxt;
  local_410 = CONCAT71((int7)((ulong)paVar14 >> 8),1);
  if (p_Var32 == (_Hash_node_base *)0x0) {
    local_468 = (_Hash_node_base *)0x0;
LAB_00331aed:
    local_458 = (_Hash_node_base *)0x0;
    puVar29 = (unsigned_long *)0x0;
    puVar17 = (pointer)0x0;
LAB_00331af2:
    this_01 = &mesh->vertex_colors;
    sVar15 = VertexAttribute::vertex_count(this_01);
    if (sVar15 == 0) {
LAB_00331b27:
      local_370 = puVar29;
      local_368 = puVar17;
      sVar15 = VertexAttribute::vertex_count(&mesh->vertex_opacities);
      paVar14 = local_450;
      if (sVar15 == 0) {
LAB_00331cc4:
        puVar17 = (pointer)VertexAttribute::vertex_count(this_00);
        if (puVar17 != (pointer)0x0) {
          puVar17 = (mesh->normals).data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        puVar18 = (pointer)VertexAttribute::vertex_count(this_01);
        if (puVar18 != (pointer)0x0) {
          puVar18 = (mesh->vertex_colors).data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        puVar19 = (pointer)VertexAttribute::vertex_count(&mesh->vertex_opacities);
        if (puVar19 != (pointer)0x0) {
          puVar19 = (mesh->vertex_opacities).data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        if (paVar14 != (pointer)0x0) {
          lVar25 = 0;
          paVar41 = (pointer)0x0;
          do {
            local_448._M_dataplus._M_p =
                 (pointer)(ulong)(pvVar31->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start[(long)paVar41];
            if (paVar14 <= local_448._M_dataplus._M_p) {
              puVar29 = local_370;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa3d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              local_3c0._M_buckets = (__buckets_ptr)&local_3c0._M_before_begin;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3c0,"Invalid faceVertexIndex {}. Must be less than {}","")
              ;
              fmt::format<unsigned_long,unsigned_long>
                        ((string *)local_360,(fmt *)&local_3c0,&local_448,
                         (unsigned_long *)&local_450,puVar29);
              poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2a0,(char *)local_360._0_8_,local_360._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
              }
              if ((__node_base *)local_3c0._M_buckets != &local_3c0._M_before_begin) {
                operator_delete(local_3c0._M_buckets,
                                (ulong)((long)&(local_3c0._M_before_begin._M_nxt)->_M_nxt + 1));
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)&this->_err,local_360._0_8_);
              if ((undefined1 *)local_360._0_8_ == local_360 + 0x10) goto LAB_00332ac1;
              goto LAB_00332ab1;
            }
            if (puVar17 != (pointer)0x0) {
              *(undefined4 *)
               ((long)(local_f0.normals.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25 + 8) =
                   *(undefined4 *)(puVar17 + lVar25 + 8);
              *(undefined8 *)
               ((long)(local_f0.normals.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25) =
                   *(undefined8 *)(puVar17 + lVar25);
            }
            if ((char)local_410 == '\0') {
              *(_Hash_node_base **)
               local_f0.uv0s.
               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)paVar41]._M_elems =
                   local_458[(long)paVar41]._M_nxt;
            }
            if (local_468 != (_Hash_node_base *)0x0) {
              *(_Hash_node_base **)
               local_f0.uv1s.
               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)paVar41]._M_elems =
                   local_468[(long)paVar41]._M_nxt;
            }
            if (local_368 != (pointer)0x0) {
              *(undefined4 *)
               ((long)(local_f0.tangents.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25 + 8) =
                   *(undefined4 *)(local_368 + lVar25 + 8);
              *(undefined8 *)
               ((long)(local_f0.tangents.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25) =
                   *(undefined8 *)(local_368 + lVar25);
            }
            if (local_370 != (unsigned_long *)0x0) {
              *(undefined4 *)
               ((long)(local_f0.binormals.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25 + 8) =
                   *(undefined4 *)((long)local_370 + lVar25 + 8);
              *(undefined8 *)
               ((long)(local_f0.binormals.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25) =
                   *(undefined8 *)((long)local_370 + lVar25);
            }
            if (puVar18 != (pointer)0x0) {
              *(undefined4 *)
               ((long)(local_f0.colors.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25 + 8) =
                   *(undefined4 *)(puVar18 + lVar25 + 8);
              *(undefined8 *)
               ((long)(local_f0.colors.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar25) =
                   *(undefined8 *)(puVar18 + lVar25);
            }
            if (puVar19 != (pointer)0x0) {
              local_f0.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[(long)paVar41] =
                   *(float *)(puVar19 + (long)paVar41 * 4);
            }
            paVar41 = (pointer)((long)paVar41->_M_elems + 1);
            lVar25 = lVar25 + 0xc;
          } while (paVar41 < paVar14);
        }
        local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (uint *)0x0;
        local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        memset((DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_360,0,0xc0);
        BuildIndices<tinyusdz::tydra::DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultPackedVertexData,tinyusdz::tydra::DefaultPackedVertexDataHasher,tinyusdz::tydra::DefaultPackedVertexDataEqual>
                  (&local_f0,
                   (DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_360,
                   &local_128,&local_388);
        if ((long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
            (long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          pvVar31 = &mesh->triangulatedFaceVertexIndices;
          if ((mesh->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (mesh->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pvVar31 = pvVar1;
          }
          if ((mesh->triangulatedFaceVertexIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (mesh->triangulatedFaceVertexIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pvVar31 = pvVar1;
          }
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar31,&local_128);
          puVar26 = local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
          puVar20 = local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (puVar26 !=
              local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish &&
              local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar33 = *local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              uVar3 = *puVar26;
              bVar44 = uVar33 < uVar3;
              if (uVar33 <= uVar3) {
                uVar33 = uVar3;
              }
              if (bVar44) {
                puVar20 = puVar26;
              }
              puVar26 = puVar26 + 1;
            } while (puVar26 !=
                     local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          }
          uVar33 = *puVar20;
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &local_448,(ulong)(uVar33 + 1),(allocator_type *)local_2a0);
          if (local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar21 = 0;
            do {
              uVar28 = (ulong)local_388.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar21];
              paVar14 = (mesh->points).
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar35 = ((long)(mesh->points).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar14 >> 2) *
                       -0x5555555555555555;
              if (uVar35 < uVar28 || uVar35 - uVar28 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                           ,0x5b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
                poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa7e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"Internal error. point index out-of-range.",0x29);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_3c0._M_buckets);
                if ((__node_base *)local_3c0._M_buckets != &local_3c0._M_before_begin) {
                  operator_delete(local_3c0._M_buckets,
                                  (ulong)((long)&(local_3c0._M_before_begin._M_nxt)->_M_nxt + 1));
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                ::std::ios_base::~ios_base(local_230);
                goto LAB_00332996;
              }
              uVar3 = local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar21];
              *(float *)(local_448._M_dataplus._M_p + (ulong)uVar3 * 0xc + 8) =
                   paVar14[uVar28]._M_elems[2];
              *(undefined8 *)(local_448._M_dataplus._M_p + (ulong)uVar3 * 0xc) =
                   *(undefined8 *)paVar14[uVar28]._M_elems;
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)((long)local_388.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_388.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2));
          }
          pfVar7 = ((mesh->points).
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
          paVar14 = (mesh->points).
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          paVar41 = (mesh->points).
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (mesh->points).
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_448._M_dataplus._M_p;
          (mesh->points).
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_448._M_string_length;
          (mesh->points).
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_448.field_2._M_allocated_capacity;
          local_448._M_dataplus._M_p = (pointer)pfVar7;
          local_448._M_string_length = (size_type)paVar14;
          local_448.field_2._M_allocated_capacity = (size_type)paVar41;
          if ((pointer)pfVar7 != (pointer)0x0) {
            operator_delete(pfVar7,(long)paVar41 - (long)pfVar7);
          }
          if ((mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            iVar4 = (mesh->joint_and_weights).elementSize;
            lVar25 = (long)iVar4;
            if (lVar25 < 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa88);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              pcVar34 = "Internal error. Invalid elementSize in mesh.joint_and_weights.";
              lVar25 = 0x3e;
              goto LAB_0033221f;
            }
            __n = (ulong)(uVar33 + 1) * lVar25;
            local_100 = puVar18;
            ::std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_448,__n,
                       (allocator_type *)local_2a0);
            ::std::vector<float,_std::allocator<float>_>::vector
                      (&local_428,__n,(allocator_type *)local_2a0);
            puVar18 = local_100;
            pfVar7 = (float *)(mesh->joint_and_weights).jointIndices.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
            paVar14 = (pointer)(mesh->joint_and_weights).jointIndices.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
            if ((long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0) {
              p_Var30 = (_Base_ptr)
                        (mesh->joint_and_weights).jointWeights.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
              paVar38 = (array<float,_3UL> *)
                        (mesh->joint_and_weights).jointWeights.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            else {
              lVar43 = (long)local_388.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_388.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2;
              p_Var30 = (_Base_ptr)
                        (mesh->joint_and_weights).jointWeights.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
              paVar38 = (array<float,_3UL> *)
                        (mesh->joint_and_weights).jointWeights.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              local_3c8 = (_Base_ptr)((long)paVar38 - (long)p_Var30 >> 2);
              local_f8 = (_Base_ptr)
                         local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
              lVar27 = 0;
              do {
                pfVar36 = pfVar7;
                _Var40._M_p = local_448._M_dataplus._M_p;
                lVar42 = lVar25;
                local_110 = paVar38;
                local_108 = paVar14;
                if ((ulong)((long)paVar14 - (long)pfVar7 >> 2) <=
                    (ulong)(local_388.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar27] * iVar4)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                             ,0x5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3)
                  ;
                  poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa91);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                  pcVar34 = "Internal error. point index exceeds jointIndices.size.";
LAB_00333502:
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,pcVar34,0x36);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_3c0._M_buckets)
                  ;
                  if ((__node_base *)local_3c0._M_buckets != &local_3c0._M_before_begin) {
                    operator_delete(local_3c0._M_buckets,
                                    (ulong)((long)&(local_3c0._M_before_begin._M_nxt)->_M_nxt + 1));
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                  ::std::ios_base::~ios_base(local_230);
                  if ((_Base_ptr)
                      local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
                    operator_delete(local_428.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_428.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_428.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
LAB_00332996:
                  if ((float *)local_448._M_dataplus._M_p != (float *)0x0) {
                    operator_delete(local_448._M_dataplus._M_p,
                                    local_448.field_2._M_allocated_capacity -
                                    (long)local_448._M_dataplus._M_p);
                  }
                  goto LAB_003322ab;
                }
                do {
                  *(float *)((long)_Var40._M_p +
                            (ulong)local_128.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar27] * lVar25 * 4) =
                       *(float *)((long)pfVar36 +
                                 (ulong)local_388.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar27] *
                                 lVar25 * 4);
                  pfVar36 = pfVar36 + 1;
                  _Var40._M_p = _Var40._M_p + 4;
                  lVar42 = lVar42 + -1;
                } while (lVar42 != 0);
                uVar33 = local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar27];
                if (local_3c8 <= (_Base_ptr)(ulong)(uVar33 * iVar4)) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                             ,0x5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3)
                  ;
                  poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa9c);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                  pcVar34 = "Internal error. point index exceeds jointWeights.size.";
                  goto LAB_00333502;
                }
                uVar3 = local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar27];
                lVar42 = 0;
                do {
                  ((_Rb_tree_color *)
                  local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start)[(ulong)uVar3 * lVar25 + lVar42] =
                       (&p_Var30->_M_color)[(ulong)uVar33 * lVar25 + lVar42];
                  lVar42 = lVar42 + 1;
                } while (lVar25 != lVar42);
                lVar27 = lVar27 + 1;
              } while (lVar27 != lVar43 + (ulong)(lVar43 == 0));
            }
            paVar41 = (pointer)(mesh->joint_and_weights).jointIndices.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
            (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_448._M_dataplus._M_p;
            (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_448._M_string_length;
            (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_448.field_2._M_allocated_capacity;
            p_Var23 = (_Base_ptr)
                      (mesh->joint_and_weights).jointWeights.
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            (mesh->joint_and_weights).jointWeights.super__Vector_base<float,_std::allocator<float>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (mesh->joint_and_weights).jointWeights.super__Vector_base<float,_std::allocator<float>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (mesh->joint_and_weights).jointWeights.super__Vector_base<float,_std::allocator<float>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_448._M_dataplus._M_p = (pointer)pfVar7;
            local_448._M_string_length = (size_type)paVar14;
            local_448.field_2._M_allocated_capacity = (size_type)paVar41;
            local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)p_Var30;
            local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = paVar38->_M_elems;
            local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)p_Var23;
            if (p_Var30 != (_Base_ptr)0x0) {
              operator_delete(p_Var30,(long)p_Var23 - (long)p_Var30);
            }
            if ((float *)local_448._M_dataplus._M_p != (float *)0x0) {
              operator_delete(local_448._M_dataplus._M_p,
                              local_448.field_2._M_allocated_capacity -
                              (long)local_448._M_dataplus._M_p);
            }
          }
          if ((mesh->targets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            local_3c0._M_buckets = &local_3c0._M_single_bucket;
            local_3c0._M_bucket_count = 1;
            local_3c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_3c0._M_element_count = 0;
            local_3c0._M_rehash_policy._M_max_load_factor = 1.0;
            local_3c0._M_rehash_policy._M_next_resize = 0;
            local_3c0._M_single_bucket = (__node_base_ptr)0x0;
            if (local_360._8_8_ != local_360._0_8_) {
              lVar25 = 0;
              uVar21 = 0;
              do {
                this_03 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_3c0,(key_type *)(local_360._0_8_ + lVar25));
                local_2a0[0]._M_elems[0] = (float)(uint)uVar21;
                __position._M_current =
                     (this_03->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this_03->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(this_03,__position,(uint *)local_2a0);
                }
                else {
                  *__position._M_current = (uint)uVar21;
                  (this_03->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                uVar21 = uVar21 + 1;
                lVar25 = lVar25 + 4;
              } while (uVar21 < (ulong)((long)(local_360._8_8_ - local_360._0_8_) >> 2));
            }
            p_Var23 = (mesh->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var30 = &(mesh->targets)._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var37 = p_Var30;
            if (p_Var23 != p_Var30) {
              do {
                local_3c8 = p_Var37;
                local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_3f8 = (array<float,_3UL> *)0x0;
                local_408 = (_Base_ptr)0x0;
                iStack_400._M_current = (array<float,_3UL> *)0x0;
                local_3d8 = (_Base_ptr)0x0;
                local_3e8 = (_Base_ptr)0x0;
                iStack_3e0._M_current = (uint *)0x0;
                p_Var37 = *(_Base_ptr *)(p_Var23 + 5);
                p_Var39 = p_Var23[5]._M_parent;
                if (p_Var39 == p_Var37) {
                  local_3f8 = (array<float,_3UL> *)0x0;
                  local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_3d8 = (_Base_ptr)0x0;
                  local_3e8._0_4_ = _S_red;
                  local_3e8._4_4_ = 0;
                  iStack_3e0._M_current._0_4_ = 0;
                  iStack_3e0._M_current._4_4_ = 0;
                  local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = 0;
                  local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start._4_4_ = 0;
                  local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_ = _S_red;
                  local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish._4_4_ = 0;
                  local_408._0_4_ = 0;
                  local_408._4_4_ = 0;
                  iStack_400._M_current._0_4_ = 0;
                  iStack_400._M_current._4_4_ = 0;
                }
                else {
                  uVar21 = 0;
                  do {
                    _Var5 = (&p_Var37->_M_color)[uVar21];
                    uVar28 = (ulong)_Var5 % local_3c0._M_bucket_count;
                    if (((__node_base *)(local_3c0._M_buckets + uVar28))->_M_nxt ==
                        (_Hash_node_base *)0x0) {
LAB_00333324:
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"():",3);
                      poVar16 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_2a0,0xabf);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                      pcVar34 = "Invalid pointIndices value.";
LAB_003336f5:
                      lVar25 = 0x1b;
LAB_003336fa:
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,pcVar34,lVar25);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"\n",1);
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append
                                ((char *)&this->_err,(ulong)local_448._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_448._M_dataplus._M_p != &local_448.field_2) {
                        operator_delete(local_448._M_dataplus._M_p,
                                        (ulong)(local_448.field_2._M_allocated_capacity + 1));
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                      ::std::ios_base::~ios_base(local_230);
                      if (local_3e8 != (_Base_ptr)0x0) {
                        operator_delete(local_3e8,(long)local_3d8 - (long)local_3e8);
                      }
                      if (local_408 != (_Base_ptr)0x0) {
                        operator_delete(local_408,(long)local_3f8 - (long)local_408);
                      }
                      if ((_Base_ptr)
                          local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
                        operator_delete(local_428.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_428.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_428.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      ::std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::~_Hashtable(&local_3c0);
                      goto LAB_003322ab;
                    }
                    p_Var32 = ((__node_base *)(local_3c0._M_buckets + uVar28))->_M_nxt->_M_nxt;
                    _Var6 = *(_Rb_tree_color *)&p_Var32[1]._M_nxt;
                    p_Var22 = p_Var32;
                    if (_Var5 != _Var6) {
                      do {
                        p_Var22 = p_Var22->_M_nxt;
                        if ((p_Var22 == (_Hash_node_base *)0x0) ||
                           ((ulong)*(_Rb_tree_color *)&p_Var22[1]._M_nxt % local_3c0._M_bucket_count
                            != uVar28)) goto LAB_00333324;
                      } while (_Var5 != *(_Rb_tree_color *)&p_Var22[1]._M_nxt);
                      while (_Var5 != _Var6) {
                        p_Var32 = p_Var32->_M_nxt;
                        if ((p_Var32 == (_Hash_node_base *)0x0) ||
                           (_Var6 = *(_Rb_tree_color *)&p_Var32[1]._M_nxt,
                           (ulong)_Var6 % local_3c0._M_bucket_count != uVar28)) {
                          ::std::__throw_out_of_range("_Map_base::at");
                        }
                      }
                    }
                    if (p_Var32[3]._M_nxt != p_Var32[2]._M_nxt) {
                      lVar25 = 0;
                      uVar28 = 0;
                      do {
                        lVar27 = *(long *)(p_Var23 + 6) - (long)p_Var23[5]._M_right;
                        if (lVar27 != 0) {
                          if ((ulong)((lVar27 >> 2) * -0x5555555555555555) <= uVar21) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       ,0x5b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,"():",3);
                            poVar16 = (ostream *)
                                      ::std::ostream::operator<<((ostringstream *)local_2a0,0xac6);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                            pcVar34 = "Invalid pointOffsets.size.";
                            lVar25 = 0x1a;
                            goto LAB_003336fa;
                          }
                          p_Var2 = &(p_Var23[5]._M_right)->_M_color + uVar21 * 3;
                          if (local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            ::std::
                            vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>::
                            _M_realloc_insert<std::array<float,3ul>const&>
                                      ((vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                        *)&local_428,
                                       (iterator)
                                       local_428.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,
                                       (array<float,_3UL> *)p_Var2);
                          }
                          else {
                            local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish[2] = (float)p_Var2[2];
                            *(undefined8 *)
                             local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish = *(undefined8 *)p_Var2;
                            local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((long)local_428.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish + 0xc);
                          }
                        }
                        lVar27 = (long)p_Var23[6]._M_right - (long)p_Var23[6]._M_left;
                        if (lVar27 != 0) {
                          if ((ulong)((lVar27 >> 2) * -0x5555555555555555) <= uVar21) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       ,0x5b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,"():",3);
                            poVar16 = (ostream *)
                                      ::std::ostream::operator<<((ostringstream *)local_2a0,0xacc);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                            pcVar34 = "Invalid normalOffsets.size.";
                            goto LAB_003336f5;
                          }
                          p_Var2 = &(p_Var23[6]._M_left)->_M_color + uVar21 * 3;
                          if (iStack_400._M_current == local_3f8) {
                            ::std::
                            vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>::
                            _M_realloc_insert<std::array<float,3ul>const&>
                                      ((vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                        *)&local_408,iStack_400,(array<float,_3UL> *)p_Var2);
                          }
                          else {
                            (iStack_400._M_current)->_M_elems[2] = (float)p_Var2[2];
                            *(undefined8 *)(iStack_400._M_current)->_M_elems = *(undefined8 *)p_Var2
                            ;
                            iStack_400._M_current = iStack_400._M_current + 1;
                          }
                        }
                        p_Var22 = p_Var32[2]._M_nxt;
                        puVar20 = (uint *)((long)&p_Var22->_M_nxt + lVar25);
                        if ((_Base_ptr)iStack_3e0._M_current == local_3d8) {
                          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                          _M_realloc_insert<unsigned_int_const&>
                                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_3e8
                                     ,iStack_3e0,puVar20);
                          p_Var22 = p_Var32[2]._M_nxt;
                        }
                        else {
                          *iStack_3e0._M_current = *puVar20;
                          iStack_3e0._M_current = iStack_3e0._M_current + 1;
                        }
                        uVar28 = uVar28 + 1;
                        lVar25 = lVar25 + 4;
                      } while (uVar28 < (ulong)((long)p_Var32[3]._M_nxt - (long)p_Var22 >> 2));
                      p_Var37 = *(_Base_ptr *)(p_Var23 + 5);
                      p_Var39 = p_Var23[5]._M_parent;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < (ulong)((long)p_Var39 - (long)p_Var37 >> 2));
                  p_Var30 = local_3c8;
                }
                p_Var8 = p_Var23[5]._M_left;
                p_Var23[5]._M_color = (_Rb_tree_color)local_3e8;
                *(undefined4 *)&p_Var23[5].field_0x4 = local_3e8._4_4_;
                *(undefined4 *)&p_Var23[5]._M_parent = iStack_3e0._M_current._0_4_;
                *(undefined4 *)((long)&p_Var23[5]._M_parent + 4) = iStack_3e0._M_current._4_4_;
                p_Var23[5]._M_left = local_3d8;
                p_Var9 = p_Var23[6]._M_parent;
                p_Var23[6]._M_parent =
                     (_Base_ptr)
                     local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                p_Var11 = p_Var23[5]._M_right;
                paVar38 = *(array<float,_3UL> **)(p_Var23 + 6);
                *(undefined4 *)&p_Var23[5]._M_right =
                     local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_;
                *(undefined4 *)((long)&p_Var23[5]._M_right + 4) =
                     local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_;
                p_Var23[6]._M_color =
                     (_Rb_tree_color)
                     local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                *(undefined4 *)&p_Var23[6].field_0x4 =
                     local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_;
                p_Var10 = p_Var23[6]._M_left;
                p_Var12 = p_Var23[6]._M_right;
                paVar13 = *(array<float,_3UL> **)(p_Var23 + 7);
                *(undefined4 *)&p_Var23[6]._M_left = (undefined4)local_408;
                *(undefined4 *)((long)&p_Var23[6]._M_left + 4) = local_408._4_4_;
                *(undefined4 *)&p_Var23[6]._M_right = iStack_400._M_current._0_4_;
                *(undefined4 *)((long)&p_Var23[6]._M_right + 4) = iStack_400._M_current._4_4_;
                *(array<float,_3UL> **)(p_Var23 + 7) = local_3f8;
                local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)p_Var11;
                local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = paVar38->_M_elems;
                local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)p_Var9;
                local_408 = p_Var10;
                iStack_400._M_current = (array<float,_3UL> *)p_Var12;
                local_3f8 = paVar13;
                local_3e8 = p_Var37;
                iStack_3e0._M_current = &p_Var39->_M_color;
                local_3d8 = p_Var8;
                if (p_Var37 != (_Base_ptr)0x0) {
                  operator_delete(p_Var37,(long)p_Var8 - (long)p_Var37);
                }
                if (local_408 != (_Base_ptr)0x0) {
                  operator_delete(local_408,(long)local_3f8 - (long)local_408);
                }
                if ((_Base_ptr)
                    local_428.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
                  operator_delete(local_428.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_428.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_428.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                p_Var23 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var23);
                p_Var37 = local_3c8;
              } while (p_Var23 != p_Var30);
            }
            ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&local_3c0);
          }
          if (puVar17 != (pointer)0x0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &(mesh->normals).data,(long)local_340 - local_360._24_8_);
            memcpy((mesh->normals).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,(void *)local_360._24_8_,
                   (long)local_340 - local_360._24_8_);
            (mesh->normals).variability = Vertex;
          }
          this_02 = &mesh->texcoords;
          if ((char)local_410 == '\0') {
            local_2a0[0]._M_elems._0_8_ = local_2a0[0]._M_elems._0_8_ & 0xffffffff00000000;
            pmVar24 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_02,(key_type *)local_2a0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pmVar24->data,
                       (long)local_328 - (long)local_330);
            memcpy((pmVar24->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start,local_330,
                   (long)local_328 - (long)local_330);
            local_2a0[0]._M_elems._0_8_ = local_2a0[0]._M_elems._0_8_ & 0xffffffff00000000;
            pmVar24 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_02,(key_type *)local_2a0);
            pmVar24->variability = Vertex;
          }
          if (local_468 != (_Hash_node_base *)0x0) {
            local_2a0[0]._M_elems[0] = 1.4013e-45;
            pmVar24 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_02,(key_type *)local_2a0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pmVar24->data,
                       (long)local_310 - (long)local_318);
            memcpy((pmVar24->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start,local_318,
                   (long)local_310 - (long)local_318);
            local_2a0[0]._M_elems[0] = 1.4013e-45;
            pmVar24 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_02,(key_type *)local_2a0);
            pmVar24->variability = Vertex;
          }
          if (local_368 != (pointer)0x0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &(mesh->tangents).data,(long)local_2f8 - (long)local_300);
            memcpy((mesh->tangents).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,local_300,(long)local_2f8 - (long)local_300);
            (mesh->tangents).variability = Vertex;
          }
          if (local_370 != (unsigned_long *)0x0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &(mesh->binormals).data,(long)local_2e0 - (long)local_2e8);
            memcpy((mesh->binormals).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,local_2e8,(long)local_2e0 - (long)local_2e8);
            (mesh->binormals).variability = Vertex;
          }
          if (puVar18 != (pointer)0x0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &(mesh->vertex_colors).data,(long)local_2c8 - (long)local_2d0);
            memcpy((mesh->vertex_colors).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,local_2d0,(long)local_2c8 - (long)local_2d0);
            (mesh->vertex_colors).variability = Vertex;
          }
          bVar44 = true;
          if (puVar19 != (pointer)0x0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &(mesh->vertex_opacities).data,(long)local_2b0 - (long)local_2b8);
            memcpy((mesh->vertex_opacities).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,local_2b8,(long)local_2b0 - (long)local_2b8);
            (mesh->vertex_opacities).variability = Vertex;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa63);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar34 = "Internal error. out_indices.size != out_point_indices.";
          lVar25 = 0x36;
LAB_0033221f:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar34,lVar25);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_3c0._M_buckets);
          if ((__node_base *)local_3c0._M_buckets != &local_3c0._M_before_begin) {
            operator_delete(local_3c0._M_buckets,
                            (ulong)((long)&(local_3c0._M_before_begin._M_nxt)->_M_nxt + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
          ::std::ios_base::~ios_base(local_230);
LAB_003322ab:
          bVar44 = false;
        }
        DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexOutput
                  ((DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_360);
        if (local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_388.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_388.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (uint *)0x0) {
          operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_00332ae4;
      }
      if ((mesh->vertex_opacities).variability == FaceVarying) {
        paVar14 = (pointer)VertexAttribute::vertex_count(this_01);
        if (paVar14 == local_450) goto LAB_00331cc4;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
        poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa25);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        pcVar34 = 
        "Internal error. The number of vertex_opacity items does not match with the number of facevarying items."
        ;
        lVar25 = 0x67;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
        poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa20);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        pcVar34 = "Internal error. vertex_opacities must be \'facevarying\' variability.";
        lVar25 = 0x43;
      }
    }
    else if ((mesh->vertex_colors).variability == FaceVarying) {
      paVar14 = (pointer)VertexAttribute::vertex_count(this_01);
      if (paVar14 == local_450) goto LAB_00331b27;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa18);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      pcVar34 = 
      "Internal error. The number of vertex_color items does not match with the number of facevarying items."
      ;
      lVar25 = 0x65;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa13);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      pcVar34 = "Internal error. vertex_colors must be \'facevarying\' variability.";
      lVar25 = 0x40;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar34,lVar25);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
    ::std::__cxx11::stringbuf::str();
  }
  else {
    local_458 = (_Hash_node_base *)0x0;
    local_468 = (_Hash_node_base *)0x0;
    do {
      sVar15 = VertexAttribute::vertex_count((VertexAttribute *)(p_Var32 + 2));
      if (sVar15 != 0) {
        if (*(int *)&p_Var32[0xe]._M_nxt != 4) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x9da);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar34 = "Internal error. texcoords must be \'facevarying\' variability.";
          goto LAB_00331a30;
        }
        paVar14 = (pointer)VertexAttribute::vertex_count((VertexAttribute *)(p_Var32 + 2));
        if (paVar14 != local_450) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x9df);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar34 = 
          "Internal error. The number of texcoord items does not match with the number of facevarying items."
          ;
          goto LAB_00331ad6;
        }
        if (*(int *)&p_Var32[1]._M_nxt == 1) {
          local_468 = p_Var32[8]._M_nxt;
        }
        else if (*(int *)&p_Var32[1]._M_nxt == 0) {
          local_458 = p_Var32[8]._M_nxt;
        }
      }
      p_Var32 = p_Var32->_M_nxt;
    } while (p_Var32 != (_Hash_node_base *)0x0);
    if (local_458 == (_Hash_node_base *)0x0) goto LAB_00331aed;
    sVar15 = VertexAttribute::vertex_count(&mesh->tangents);
    if (sVar15 == 0) {
      puVar17 = (pointer)0x0;
LAB_00332086:
      sVar15 = VertexAttribute::vertex_count(&mesh->binormals);
      if (sVar15 != 0) {
        if ((mesh->binormals).variability == FaceVarying) {
          paVar14 = (pointer)VertexAttribute::vertex_count(&mesh->binormals);
          if (paVar14 == local_450) {
            puVar29 = (unsigned_long *)
                      (mesh->binormals).data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_410 = 0;
            goto LAB_00331af2;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa09);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar34 = 
          "Internal error. The number of binormals items does not match with the number of facevarying items."
          ;
          lVar25 = 0x62;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0xa04);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar34 = "Internal error. binormals must be \'facevarying\' variability.";
LAB_00331a30:
          lVar25 = 0x3c;
        }
        goto LAB_00332a57;
      }
      local_410 = 0;
      puVar29 = (unsigned_long *)0x0;
      goto LAB_00331af2;
    }
    if ((mesh->tangents).variability == FaceVarying) {
      paVar14 = (pointer)VertexAttribute::vertex_count(&mesh->tangents);
      if (paVar14 == local_450) {
        puVar17 = (mesh->tangents).data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_00332086;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x9fa);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      pcVar34 = 
      "Internal error. The number of tangents items does not match with the number of facevarying items."
      ;
LAB_00331ad6:
      lVar25 = 0x61;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x9f5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      pcVar34 = "Internal error. tangents must be \'facevarying\' variability.";
      lVar25 = 0x3b;
    }
LAB_00332a57:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar34,lVar25);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
    ::std::__cxx11::stringbuf::str();
  }
  ::std::__cxx11::string::_M_append((char *)&this->_err,local_360._0_8_);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
LAB_00332ab1:
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
LAB_00332ac1:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
  ::std::ios_base::~ios_base(local_230);
  bVar44 = false;
LAB_00332ae4:
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexInput(&local_f0);
  return bVar44;
}

Assistant:

bool RenderSceneConverter::BuildVertexIndicesImpl(RenderMesh &mesh) {
  //
  // - If mesh is triangulated, use triangulatedFaceVertexIndices, otherwise use
  // faceVertxIndices.
  // - Make vertex attributes 'facevarying' variability
  // - Assign same id for similar(currently identitical) vertex attribute.
  // - Reorder vertex attributes to 'vertex' variability.
  //

  const std::vector<uint32_t> &fvIndices =
      mesh.triangulatedFaceVertexIndices.size()
          ? mesh.triangulatedFaceVertexIndices
          : mesh.usdFaceVertexIndices;

  DefaultVertexInput<DefaultPackedVertexData> vertex_input;

  size_t num_fvs = fvIndices.size();
  vertex_input.point_indices = fvIndices;
  vertex_input.uv0s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.uv1s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.normals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.tangents.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.binormals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.colors.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.opacities.assign(num_fvs, 0.0f);

  if (mesh.normals.vertex_count()) {
    if (!mesh.normals.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. normals must be 'facevarying' variability.");
    }
    if (mesh.normals.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of normal items does not match with "
          "the number of facevarying items.");
    }
  }

  const value::float2 *texcoord0_ptr = nullptr;
  const value::float2 *texcoord1_ptr = nullptr;

  for (const auto &it : mesh.texcoords) {
    if (it.second.vertex_count() > 0) {
      if (!it.second.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. texcoords must be 'facevarying' variability.");
      }
      if (it.second.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of texcoord items does not match "
            "with the number of facevarying items.");
      }

      if (it.first == 0) {
        texcoord0_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else if (it.first == 1) {
        texcoord1_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else {
        // ignore.
      }
    }
  }

  const value::float3 *tangents_ptr = nullptr;
  const value::float3 *binormals_ptr = nullptr;

  if (texcoord0_ptr) {
    if (mesh.tangents.vertex_count()) {
      if (!mesh.tangents.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. tangents must be 'facevarying' variability.");
      }
      if (mesh.tangents.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of tangents items does not match "
            "with the number of facevarying items.");
      }

      tangents_ptr = reinterpret_cast<const value::float3 *>(
          mesh.tangents.get_data().data());
    }

    if (mesh.binormals.vertex_count()) {
      if (!mesh.binormals.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. binormals must be 'facevarying' variability.");
      }
      if (mesh.binormals.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of binormals items does not match "
            "with the number of facevarying items.");
      }
      binormals_ptr = reinterpret_cast<const value::float3 *>(
          mesh.binormals.get_data().data());
    }
  }

  if (mesh.vertex_colors.vertex_count()) {
    if (!mesh.vertex_colors.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_colors must be 'facevarying' variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_color items does not match "
          "with the number of facevarying items.");
    }
  }

  if (mesh.vertex_opacities.vertex_count()) {
    if (!mesh.vertex_opacities.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_opacities must be 'facevarying' "
          "variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_opacity items does not match "
          "with the number of facevarying items.");
    }
  }

  const value::float3 *normals_ptr =
      (mesh.normals.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.normals.get_data().data())
          : nullptr;
  const value::float3 *colors_ptr =
      (mesh.vertex_colors.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.vertex_colors.get_data().data())
          : nullptr;
  const float *opacities_ptr =
      (mesh.vertex_opacities.vertex_count() > 0)
          ? reinterpret_cast<const float *>(
                mesh.vertex_opacities.get_data().data())
          : nullptr;

  for (size_t i = 0; i < num_fvs; i++) {
    size_t fvi = fvIndices[i];
    if (fvi >= num_fvs) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Invalid faceVertexIndex {}. Must be less than {}", fvi, num_fvs));
    }

    if (normals_ptr) {
      vertex_input.normals[i] = normals_ptr[i];
    }
    if (texcoord0_ptr) {
      vertex_input.uv0s[i] = texcoord0_ptr[i];
    }
    if (texcoord1_ptr) {
      vertex_input.uv1s[i] = texcoord1_ptr[i];
    }
    if (tangents_ptr) {
      vertex_input.tangents[i] = tangents_ptr[i];
    }
    if (binormals_ptr) {
      vertex_input.binormals[i] = binormals_ptr[i];
    }
    if (colors_ptr) {
      vertex_input.colors[i] = colors_ptr[i];
    }
    if (opacities_ptr) {
      vertex_input.opacities[i] = opacities_ptr[i];
    }
  }

  std::vector<uint32_t> out_indices;
  std::vector<uint32_t> out_point_indices;  // to reorder position data
  DefaultVertexOutput<DefaultPackedVertexData> vertex_output;

  BuildIndices<DefaultVertexInput<DefaultPackedVertexData>,
               DefaultVertexOutput<DefaultPackedVertexData>,
               DefaultPackedVertexData, DefaultPackedVertexDataHasher,
               DefaultPackedVertexDataEqual>(vertex_input, vertex_output,
                                             out_indices, out_point_indices);

  if (out_indices.size() != out_point_indices.size()) {
    PUSH_ERROR_AND_RETURN(
        "Internal error. out_indices.size != out_point_indices.");
  }

  DCOUT("faceVertexIndices.size : " << fvIndices.size());
  DCOUT("# of indices after the build: "
        << out_indices.size() << ", reduced "
        << (fvIndices.size() - out_indices.size()) << " indices.");

  if (mesh.is_triangulated()) {
    mesh.triangulatedFaceVertexIndices = out_indices;
  } else {
    mesh.usdFaceVertexIndices = out_indices;
  }

  //
  // Reorder 'vertex' varying attributes(points, jointIndices/jointWeights,
  // BlendShape points, ...)
  // TODO: Preserve input order as much as possible.
  //
  {
    uint32_t numPoints =
        *std::max_element(out_indices.begin(), out_indices.end()) + 1;
    {
      std::vector<value::float3> tmp_points(numPoints);
      // TODO: Use vertex_output[i].point_index?
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if (out_point_indices[i] >= mesh.points.size()) {
          PUSH_ERROR_AND_RETURN("Internal error. point index out-of-range.");
        }
        tmp_points[out_indices[i]] = mesh.points[out_point_indices[i]];
      }
      mesh.points.swap(tmp_points);
    }

    if (mesh.joint_and_weights.jointIndices.size()) {
      if (mesh.joint_and_weights.elementSize < 1) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. Invalid elementSize in mesh.joint_and_weights.");
      }
      uint32_t elementSize = uint32_t(mesh.joint_and_weights.elementSize);
      std::vector<int> tmp_indices(size_t(numPoints) * size_t(elementSize));
      std::vector<float> tmp_weights(size_t(numPoints) * size_t(elementSize));
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointIndices.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointIndices.size.");
        }
        for (size_t k = 0; k < elementSize; k++) {
          tmp_indices[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointIndices[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }

        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointWeights.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointWeights.size.");
        }

        for (size_t k = 0; k < elementSize; k++) {
          tmp_weights[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointWeights[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }
      }
      mesh.joint_and_weights.jointIndices.swap(tmp_indices);
      mesh.joint_and_weights.jointWeights.swap(tmp_weights);
    }

    if (mesh.targets.size()) {
      // For BlendShape, reordering pointIndices, pointOffsets and normalOffsets is not enough.
      // Some points could be duplicated, so we need to find a mapping of org pointIdx -> pointIdx list in reordered points,
      // Then splat point attributes accordingly.

      // org pointIdx -> List of pointIdx in reordered points.
      std::unordered_map<uint32_t, std::vector<uint32_t>> pointIdxRemap;

      for (size_t i = 0; i < vertex_output.size(); i++) {
        pointIdxRemap[vertex_output.point_indices[i]].push_back(uint32_t(i));
      }

      for (auto &target : mesh.targets) {

        std::vector<value::float3> tmpPointOffsets;
        std::vector<value::float3> tmpNormalOffsets;
        std::vector<uint32_t> tmpPointIndices;

        for (size_t i = 0; i < target.second.pointIndices.size(); i++) {

          uint32_t orgPointIdx = target.second.pointIndices[i];
          if (!pointIdxRemap.count(orgPointIdx)) {
            PUSH_ERROR_AND_RETURN("Invalid pointIndices value.");
          }
          const std::vector<uint32_t> &dstPointIndices = pointIdxRemap.at(orgPointIdx);

          for (size_t k = 0; k < dstPointIndices.size(); k++) {
            if (target.second.pointOffsets.size()) {
              if (i >= target.second.pointOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid pointOffsets.size.");
              }
              tmpPointOffsets.push_back(target.second.pointOffsets[i]);
            }
            if (target.second.normalOffsets.size()) {
              if (i >= target.second.normalOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid normalOffsets.size.");
              }
              tmpNormalOffsets.push_back(target.second.normalOffsets[i]);
            }

            tmpPointIndices.push_back(dstPointIndices[k]);
          }
        }

        target.second.pointIndices.swap(tmpPointIndices);
        target.second.pointOffsets.swap(tmpPointOffsets);
        target.second.normalOffsets.swap(tmpNormalOffsets);

      }

      // TODO: Inbetween BlendShapes

    }

  }

  // Other 'facevarying' attributes are now 'vertex' variability
  if (normals_ptr) {
    mesh.normals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.normals.data()),
        vertex_output.normals.size() * sizeof(value::float3));
    mesh.normals.variability = VertexVariability::Vertex;
  }

  if (texcoord0_ptr) {
    mesh.texcoords[0].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv0s.data()),
        vertex_output.uv0s.size() * sizeof(value::float2));
    mesh.texcoords[0].variability = VertexVariability::Vertex;
  }

  if (texcoord1_ptr) {
    mesh.texcoords[1].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv1s.data()),
        vertex_output.uv1s.size() * sizeof(value::float2));
    mesh.texcoords[1].variability = VertexVariability::Vertex;
  }

  if (tangents_ptr) {
    mesh.tangents.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.tangents.data()),
        vertex_output.tangents.size() * sizeof(value::float3));
    mesh.tangents.variability = VertexVariability::Vertex;
  }

  if (binormals_ptr) {
    mesh.binormals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.binormals.data()),
        vertex_output.binormals.size() * sizeof(value::float3));
    mesh.binormals.variability = VertexVariability::Vertex;
  }

  if (colors_ptr) {
    mesh.vertex_colors.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.colors.data()),
        vertex_output.colors.size() * sizeof(value::float3));
    mesh.vertex_colors.variability = VertexVariability::Vertex;
  }

  if (opacities_ptr) {
    mesh.vertex_opacities.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.opacities.data()),
        vertex_output.opacities.size() * sizeof(float));
    mesh.vertex_opacities.variability = VertexVariability::Vertex;
  }

  return true;
}